

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O1

string * __thiscall
flatbuffers::lobster::LobsterGenerator::LobsterType_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Type *type)

{
  BaseType BVar1;
  char *pcVar2;
  char *pcVar3;
  
  BVar1 = type->base_type;
  if (BVar1 - BASE_TYPE_FLOAT < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "float";
    pcVar2 = "";
  }
  else if (BVar1 == BASE_TYPE_BOOL) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "bool";
    pcVar2 = "";
  }
  else {
    if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
      if (type->enum_def != (EnumDef *)0x0) {
        EscapeKeyword(__return_storage_ptr__,this,(string *)type->enum_def);
        return __return_storage_ptr__;
      }
      if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (BVar1 == BASE_TYPE_STRING) {
          pcVar3 = "string";
          pcVar2 = "";
        }
        else {
          pcVar3 = "int";
          pcVar2 = "";
        }
        goto LAB_002a7782;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "flatbuffers.offset";
    pcVar2 = "";
  }
LAB_002a7782:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string LobsterType(const Type &type) {
    if (IsFloat(type.base_type)) return "float";
    if (IsBool(type.base_type)) return "bool";
    if (IsScalar(type.base_type) && type.enum_def)
      return NormalizedName(*type.enum_def);
    if (!IsScalar(type.base_type)) return "flatbuffers.offset";
    if (IsString(type)) return "string";
    return "int";
  }